

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O2

verifier<jwt::default_clock> * __thiscall
jwt::verifier<jwt::default_clock>::with_issuer(verifier<jwt::default_clock> *this,string *iss)

{
  verifier<jwt::default_clock> *pvVar1;
  allocator<char> local_61;
  value local_60;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"iss",&local_61);
  std::__cxx11::string::string((string *)&local_50,(string *)iss);
  picojson::value::value(&local_60,&local_50);
  pvVar1 = with_claim(this,&local_30,(claim *)&local_60);
  picojson::value::clear(&local_60);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return pvVar1;
}

Assistant:

verifier& with_issuer(const std::string& iss) { return with_claim("iss", claim(iss)); }